

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<short> * __thiscall
tcb::rational<short>::operator-=(rational<short> *this,rational<short> *other)

{
  short sVar1;
  short sVar2;
  
  sVar1 = other->denom_;
  sVar2 = this->num_ * sVar1;
  this->num_ = sVar2;
  this->num_ = sVar2 - other->num_ * this->denom_;
  this->denom_ = this->denom_ * sVar1;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator-=(const rational<U>& other)
    {
        num_ *= other.denom();
        num_ -= denom_ * other.num();
        denom_ *= other.denom();
        simplify();
        return *this;
    }